

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::BVHNIntersector1<8,_257,_false,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [32];
  undefined8 uVar13;
  byte bVar14;
  undefined1 auVar15 [12];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  ulong uVar20;
  byte bVar21;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  vfloat4 a0;
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  long lStack_2580;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 auVar44 [32];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar56 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar15 = ZEXT812(0) << 0x20;
    auVar30 = ZEXT816(0) << 0x40;
    auVar55._4_12_ = auVar15;
    auVar55._0_4_ = auVar56._0_4_;
    auVar28 = vrsqrt14ss_avx512f(auVar30,auVar55);
    fVar54 = auVar28._0_4_;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    pre.depth_scale = fVar54 * 1.5 - auVar56._0_4_ * 0.5 * fVar54 * fVar54 * fVar54;
    uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar54 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar60._0_4_ = aVar6.x * pre.depth_scale;
    auVar60._4_4_ = aVar6.y * pre.depth_scale;
    auVar60._8_4_ = aVar6.z * pre.depth_scale;
    auVar60._12_4_ = aVar6.field_3.w * pre.depth_scale;
    auVar28 = vshufpd_avx(auVar60,auVar60,1);
    auVar56 = vmovshdup_avx(auVar60);
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar39._16_4_ = 0x80000000;
    auVar39._0_16_ = auVar51;
    auVar39._20_4_ = 0x80000000;
    auVar39._24_4_ = 0x80000000;
    auVar39._28_4_ = 0x80000000;
    auVar68._0_4_ = auVar56._0_4_ ^ 0x80000000;
    auVar56 = vunpckhps_avx(auVar60,auVar30);
    auVar68._4_12_ = auVar15;
    auVar31 = vshufps_avx(auVar56,auVar68,0x41);
    auVar66._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
    auVar66._8_8_ = auVar28._8_8_ ^ auVar51._8_8_;
    auVar29 = vinsertps_avx(auVar66,auVar60,0x2a);
    auVar56 = vdpps_avx(auVar31,auVar31,0x7f);
    auVar28 = vdpps_avx(auVar29,auVar29,0x7f);
    uVar13 = vcmpps_avx512vl(auVar28,auVar56,1);
    auVar56 = vpmovm2d_avx512vl(uVar13);
    auVar69._0_4_ = auVar56._0_4_;
    auVar69._4_4_ = auVar69._0_4_;
    auVar69._8_4_ = auVar69._0_4_;
    auVar69._12_4_ = auVar69._0_4_;
    uVar26 = vpmovd2m_avx512vl(auVar69);
    auVar56 = vpcmpeqd_avx(auVar69,auVar69);
    auVar28._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar56._4_4_;
    auVar28._0_4_ = (uint)((byte)uVar26 & 1) * auVar56._0_4_;
    auVar28._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar56._8_4_;
    auVar28._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar56._12_4_;
    auVar56 = vblendvps_avx(auVar29,auVar31,auVar28);
    auVar28 = vdpps_avx(auVar56,auVar56,0x7f);
    auVar70._4_12_ = auVar15;
    auVar70._0_4_ = auVar28._0_4_;
    auVar29 = vrsqrt14ss_avx512f(auVar30,auVar70);
    fVar49 = auVar29._0_4_;
    fVar49 = fVar49 * 1.5 - auVar28._0_4_ * 0.5 * fVar49 * fVar49 * fVar49;
    auVar67._0_4_ = fVar49 * auVar56._0_4_;
    auVar67._4_4_ = fVar49 * auVar56._4_4_;
    auVar67._8_4_ = fVar49 * auVar56._8_4_;
    auVar67._12_4_ = fVar49 * auVar56._12_4_;
    auVar56 = vshufps_avx(auVar67,auVar67,0xc9);
    auVar28 = vshufps_avx(auVar60,auVar60,0xc9);
    auVar71._0_4_ = auVar28._0_4_ * auVar67._0_4_;
    auVar71._4_4_ = auVar28._4_4_ * auVar67._4_4_;
    auVar71._8_4_ = auVar28._8_4_ * auVar67._8_4_;
    auVar71._12_4_ = auVar28._12_4_ * auVar67._12_4_;
    auVar56 = vfmsub231ps_fma(auVar71,auVar60,auVar56);
    auVar28 = vshufps_avx(auVar56,auVar56,0xc9);
    auVar56 = vdpps_avx(auVar28,auVar28,0x7f);
    auVar72._4_12_ = auVar15;
    auVar72._0_4_ = auVar56._0_4_;
    auVar29 = vrsqrt14ss_avx512f(auVar30,auVar72);
    fVar49 = auVar29._0_4_;
    fVar49 = fVar49 * 1.5 - fVar49 * fVar49 * fVar49 * auVar56._0_4_ * 0.5;
    auVar58._0_4_ = auVar28._0_4_ * fVar49;
    auVar58._4_4_ = auVar28._4_4_ * fVar49;
    auVar58._8_4_ = auVar28._8_4_ * fVar49;
    auVar58._12_4_ = auVar28._12_4_ * fVar49;
    auVar56._0_4_ = pre.depth_scale * auVar60._0_4_;
    auVar56._4_4_ = pre.depth_scale * auVar60._4_4_;
    auVar56._8_4_ = pre.depth_scale * auVar60._8_4_;
    auVar56._12_4_ = pre.depth_scale * auVar60._12_4_;
    auVar29 = vunpcklps_avx(auVar67,auVar56);
    auVar56 = vunpckhps_avx(auVar67,auVar56);
    auVar31 = vunpcklps_avx(auVar58,auVar30);
    auVar28 = vunpckhps_avx(auVar58,auVar30);
    pre.ray_space.vz.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar56,auVar28)
    ;
    pre.ray_space.vx.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar29,auVar31)
    ;
    pre.ray_space.vy.field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar29,auVar31)
    ;
    pSVar22 = stack + 1;
    stack[0].dist = 0;
    auVar53 = ZEXT864(0) << 0x20;
    auVar56 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar28 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar29 = vandps_avx512vl((undefined1  [16])aVar6,auVar29);
    auVar64._8_4_ = 0x219392ef;
    auVar64._0_8_ = 0x219392ef219392ef;
    auVar64._12_4_ = 0x219392ef;
    uVar26 = vcmpps_avx512vl(auVar29,auVar64,1);
    bVar25 = (bool)((byte)uVar26 & 1);
    auVar30._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar6.x;
    bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar30._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar6.y;
    bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar30._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * (int)aVar6.z;
    bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar30._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * aVar6.field_3.a;
    auVar29 = vrcp14ps_avx512vl(auVar30);
    auVar31._8_4_ = 0x3f800000;
    auVar31._0_8_ = 0x3f8000003f800000;
    auVar31._12_4_ = 0x3f800000;
    auVar31 = vfnmadd213ps_avx512vl(auVar30,auVar29,auVar31);
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    auVar30 = vfmadd132ps_fma(auVar31,auVar29,auVar29);
    uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    auVar32 = vbroadcastss_avx512vl(auVar30);
    auVar29 = vmovshdup_avx(auVar30);
    auVar33 = vbroadcastsd_avx512vl(auVar29);
    auVar31 = vshufpd_avx(auVar30,auVar30,1);
    auVar35._8_4_ = 2;
    auVar35._0_8_ = 0x200000002;
    auVar35._12_4_ = 2;
    auVar35._16_4_ = 2;
    auVar35._20_4_ = 2;
    auVar35._24_4_ = 2;
    auVar35._28_4_ = 2;
    auVar34 = vpermps_avx512vl(auVar35,ZEXT1632(auVar30));
    fVar49 = auVar30._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar36._4_4_ = fVar49;
    auVar36._0_4_ = fVar49;
    auVar36._8_4_ = fVar49;
    auVar36._12_4_ = fVar49;
    auVar36._16_4_ = fVar49;
    auVar36._20_4_ = fVar49;
    auVar36._24_4_ = fVar49;
    auVar36._28_4_ = fVar49;
    auVar37._8_4_ = 1;
    auVar37._0_8_ = 0x100000001;
    auVar37._12_4_ = 1;
    auVar37._16_4_ = 1;
    auVar37._20_4_ = 1;
    auVar37._24_4_ = 1;
    auVar37._28_4_ = 1;
    auVar38 = ZEXT1632(CONCAT412(auVar30._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar30._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar30._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar49))
                                ));
    auVar37 = vpermps_avx2(auVar37,auVar38);
    auVar38 = vpermps_avx2(auVar35,auVar38);
    uVar24 = (ulong)(auVar30._0_4_ < 0.0) * 0x20;
    uVar23 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
    uVar26 = (ulong)(auVar31._0_4_ < 0.0) << 5 | 0x80;
    auVar35 = vbroadcastss_avx512vl(auVar56);
    uVar57 = auVar28._0_4_;
    auVar50 = ZEXT3264(CONCAT428(uVar57,CONCAT424(uVar57,CONCAT420(uVar57,CONCAT416(uVar57,CONCAT412
                                                  (uVar57,CONCAT48(uVar57,CONCAT44(uVar57,uVar57))))
                                                  ))));
    auVar36 = vxorps_avx512vl(auVar36,auVar39);
    auVar37 = vxorps_avx512vl(auVar37,auVar39);
    auVar38 = vxorps_avx512vl(auVar38,auVar39);
    auVar39 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar76 = ZEXT3264(auVar39);
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar77 = ZEXT3264(auVar39);
LAB_01c524f7:
    if (pSVar22 != stack) {
      pSVar16 = pSVar22 + -1;
      auVar52 = ZEXT464(pSVar16->dist);
      pSVar22 = pSVar22 + -1;
      if ((float)pSVar16->dist <= (ray->super_RayK<1>).tfar) {
        uVar20 = (pSVar22->ptr).ptr;
LAB_01c52513:
        do {
          if ((uVar20 & 0xf) == 0) {
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar24),auVar36,auVar32);
            auVar40 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar23),auVar37,auVar33);
            auVar39 = vpmaxsd_avx2(auVar39,auVar40);
            auVar41 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + uVar26),auVar38,auVar34);
            auVar40 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar24 ^ 0x20)),auVar36,
                                 auVar32);
            auVar42 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar23 ^ 0x20)),auVar37,
                                 auVar33);
            auVar40 = vpminsd_avx2(auVar40,auVar42);
            auVar42 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar20 + 0x40 + (uVar26 ^ 0x20)),auVar38,
                                 auVar34);
            auVar41 = vpmaxsd_avx512vl(auVar41,auVar35);
            auVar39 = vpmaxsd_avx2(auVar39,auVar41);
            auVar41 = vpminsd_avx2(auVar42,auVar50._0_32_);
            auVar40 = vpminsd_avx2(auVar40,auVar41);
            uVar27 = vpcmpd_avx512vl(auVar39,auVar40,2);
          }
          else {
            if ((int)(uVar20 & 0xf) != 2) {
              auVar53 = ZEXT1664(auVar53._0_16_);
              (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(uVar20 & 0xfffffffffffffff0) * 0x40))(&pre,ray,context);
              auVar39 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
              auVar77 = ZEXT3264(auVar39);
              auVar39 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
              auVar76 = ZEXT3264(auVar39);
              fVar49 = (ray->super_RayK<1>).tfar;
              auVar50 = ZEXT3264(CONCAT428(fVar49,CONCAT424(fVar49,CONCAT420(fVar49,CONCAT416(fVar49
                                                  ,CONCAT412(fVar49,CONCAT48(fVar49,CONCAT44(fVar49,
                                                  fVar49))))))));
              break;
            }
            uVar17 = uVar20 & 0xfffffffffffffff0;
            auVar39 = *(undefined1 (*) [32])(uVar17 + 0x100);
            auVar63._0_4_ = fVar54 * auVar39._0_4_;
            auVar63._4_4_ = fVar54 * auVar39._4_4_;
            auVar63._8_4_ = fVar54 * auVar39._8_4_;
            auVar63._12_4_ = fVar54 * auVar39._12_4_;
            auVar63._16_4_ = fVar54 * auVar39._16_4_;
            auVar63._20_4_ = fVar54 * auVar39._20_4_;
            auVar63._28_36_ = auVar52._28_36_;
            auVar63._24_4_ = fVar54 * auVar39._24_4_;
            auVar40 = *(undefined1 (*) [32])(uVar17 + 0x120);
            auVar41 = *(undefined1 (*) [32])(uVar17 + 0x140);
            auVar52._0_4_ = fVar54 * auVar40._0_4_;
            auVar52._4_4_ = fVar54 * auVar40._4_4_;
            auVar52._8_4_ = fVar54 * auVar40._8_4_;
            auVar52._12_4_ = fVar54 * auVar40._12_4_;
            auVar52._16_4_ = fVar54 * auVar40._16_4_;
            auVar52._20_4_ = fVar54 * auVar40._20_4_;
            auVar52._28_36_ = auVar53._28_36_;
            auVar52._24_4_ = fVar54 * auVar40._24_4_;
            auVar42._4_4_ = fVar54 * auVar41._4_4_;
            auVar42._0_4_ = fVar54 * auVar41._0_4_;
            auVar42._8_4_ = fVar54 * auVar41._8_4_;
            auVar42._12_4_ = fVar54 * auVar41._12_4_;
            auVar42._16_4_ = fVar54 * auVar41._16_4_;
            auVar42._20_4_ = fVar54 * auVar41._20_4_;
            auVar42._24_4_ = fVar54 * auVar41._24_4_;
            auVar42._28_4_ = fVar54;
            auVar46._4_4_ = uVar2;
            auVar46._0_4_ = uVar2;
            auVar46._8_4_ = uVar2;
            auVar46._12_4_ = uVar2;
            auVar46._16_4_ = uVar2;
            auVar46._20_4_ = uVar2;
            auVar46._24_4_ = uVar2;
            auVar46._28_4_ = uVar2;
            auVar56 = vfmadd231ps_fma(auVar63._0_32_,auVar46,*(undefined1 (*) [32])(uVar17 + 0xa0));
            auVar28 = vfmadd231ps_fma(auVar52._0_32_,auVar46,*(undefined1 (*) [32])(uVar17 + 0xc0));
            auVar29 = vfmadd231ps_fma(auVar42,auVar46,*(undefined1 (*) [32])(uVar17 + 0xe0));
            auVar12._4_4_ = uVar1;
            auVar12._0_4_ = uVar1;
            auVar12._8_4_ = uVar1;
            auVar12._12_4_ = uVar1;
            auVar12._16_4_ = uVar1;
            auVar12._20_4_ = uVar1;
            auVar12._24_4_ = uVar1;
            auVar12._28_4_ = uVar1;
            auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar12,
                                      *(undefined1 (*) [32])(uVar17 + 0x40));
            auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar12,
                                      *(undefined1 (*) [32])(uVar17 + 0x60));
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar12,
                                      *(undefined1 (*) [32])(uVar17 + 0x80));
            auVar73._8_4_ = 0x7fffffff;
            auVar73._0_8_ = 0x7fffffff7fffffff;
            auVar73._12_4_ = 0x7fffffff;
            auVar73._16_4_ = 0x7fffffff;
            auVar73._20_4_ = 0x7fffffff;
            auVar73._24_4_ = 0x7fffffff;
            auVar73._28_4_ = 0x7fffffff;
            auVar42 = vandps_avx(auVar73,ZEXT1632(auVar56));
            auVar75._8_4_ = 0x219392ef;
            auVar75._0_8_ = 0x219392ef219392ef;
            auVar75._12_4_ = 0x219392ef;
            auVar75._16_4_ = 0x219392ef;
            auVar75._20_4_ = 0x219392ef;
            auVar75._24_4_ = 0x219392ef;
            auVar75._28_4_ = 0x219392ef;
            uVar27 = vcmpps_avx512vl(auVar42,auVar75,1);
            bVar25 = (bool)((byte)uVar27 & 1);
            auVar48._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar56._0_4_;
            bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar56._4_4_;
            bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar56._8_4_;
            bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar48._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar56._12_4_;
            auVar48._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
            auVar48._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
            auVar48._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
            auVar48._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
            auVar42 = vandps_avx(auVar73,ZEXT1632(auVar28));
            uVar27 = vcmpps_avx512vl(auVar42,auVar75,1);
            bVar25 = (bool)((byte)uVar27 & 1);
            auVar47._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar28._0_4_;
            bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar28._4_4_;
            bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar28._8_4_;
            bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar47._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar28._12_4_;
            auVar47._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
            auVar47._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
            auVar47._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
            auVar47._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
            auVar42 = vandps_avx(auVar73,ZEXT1632(auVar29));
            uVar27 = vcmpps_avx512vl(auVar42,auVar75,1);
            bVar25 = (bool)((byte)uVar27 & 1);
            auVar45._0_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar29._0_4_;
            bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar29._4_4_;
            bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar29._8_4_;
            bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar45._12_4_ = (uint)bVar25 * 0x219392ef | (uint)!bVar25 * auVar29._12_4_;
            auVar45._16_4_ = (uint)((byte)(uVar27 >> 4) & 1) * 0x219392ef;
            auVar45._20_4_ = (uint)((byte)(uVar27 >> 5) & 1) * 0x219392ef;
            auVar45._24_4_ = (uint)((byte)(uVar27 >> 6) & 1) * 0x219392ef;
            auVar45._28_4_ = (uint)(byte)(uVar27 >> 7) * 0x219392ef;
            auVar42 = vrcp14ps_avx512vl(auVar48);
            auVar74._8_4_ = 0x3f800000;
            auVar74._0_8_ = 0x3f8000003f800000;
            auVar74._12_4_ = 0x3f800000;
            auVar74._16_4_ = 0x3f800000;
            auVar74._20_4_ = 0x3f800000;
            auVar74._24_4_ = 0x3f800000;
            auVar74._28_4_ = 0x3f800000;
            auVar56 = vfnmadd213ps_fma(auVar48,auVar42,auVar74);
            auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar42,auVar42);
            auVar42 = vrcp14ps_avx512vl(auVar47);
            auVar28 = vfnmadd213ps_fma(auVar47,auVar42,auVar74);
            auVar28 = vfmadd132ps_fma(ZEXT1632(auVar28),auVar42,auVar42);
            auVar42 = vrcp14ps_avx512vl(auVar45);
            auVar29 = vfnmadd213ps_fma(auVar45,auVar42,auVar74);
            auVar29 = vfmadd132ps_fma(ZEXT1632(auVar29),auVar42,auVar42);
            auVar43._4_4_ = uVar5;
            auVar43._0_4_ = uVar5;
            auVar43._8_4_ = uVar5;
            auVar43._12_4_ = uVar5;
            auVar43._16_4_ = uVar5;
            auVar43._20_4_ = uVar5;
            auVar43._24_4_ = uVar5;
            auVar43._28_4_ = uVar5;
            auVar39 = vfmadd213ps_avx512vl(auVar39,auVar43,*(undefined1 (*) [32])(uVar17 + 0x160));
            auVar42 = vfmadd213ps_avx512vl(auVar40,auVar43,*(undefined1 (*) [32])(uVar17 + 0x180));
            auVar41 = vfmadd213ps_avx512vl(auVar41,auVar43,*(undefined1 (*) [32])(uVar17 + 0x1a0));
            auVar40._4_4_ = uVar4;
            auVar40._0_4_ = uVar4;
            auVar40._8_4_ = uVar4;
            auVar40._12_4_ = uVar4;
            auVar40._16_4_ = uVar4;
            auVar40._20_4_ = uVar4;
            auVar40._24_4_ = uVar4;
            auVar40._28_4_ = uVar4;
            auVar39 = vfmadd231ps_avx512vl(auVar39,auVar40,*(undefined1 (*) [32])(uVar17 + 0xa0));
            auVar42 = vfmadd231ps_avx512vl(auVar42,auVar40,*(undefined1 (*) [32])(uVar17 + 0xc0));
            auVar40 = vfmadd231ps_avx512vl(auVar41,auVar40,*(undefined1 (*) [32])(uVar17 + 0xe0));
            auVar41._4_4_ = uVar3;
            auVar41._0_4_ = uVar3;
            auVar41._8_4_ = uVar3;
            auVar41._12_4_ = uVar3;
            auVar41._16_4_ = uVar3;
            auVar41._20_4_ = uVar3;
            auVar41._24_4_ = uVar3;
            auVar41._28_4_ = uVar3;
            auVar31 = vfmadd231ps_fma(auVar39,auVar41,*(undefined1 (*) [32])(uVar17 + 0x40));
            auVar65._0_4_ = -auVar56._0_4_ * auVar31._0_4_;
            auVar65._4_4_ = -auVar56._4_4_ * auVar31._4_4_;
            auVar65._8_4_ = -auVar56._8_4_ * auVar31._8_4_;
            auVar65._12_4_ = -auVar56._12_4_ * auVar31._12_4_;
            auVar65._16_4_ = 0x80000000;
            auVar65._20_4_ = 0x80000000;
            auVar65._24_4_ = 0x80000000;
            auVar65._28_4_ = 0;
            auVar31 = vfmadd231ps_fma(auVar42,auVar41,*(undefined1 (*) [32])(uVar17 + 0x60));
            auVar61._0_4_ = -auVar28._0_4_ * auVar31._0_4_;
            auVar61._4_4_ = -auVar28._4_4_ * auVar31._4_4_;
            auVar61._8_4_ = -auVar28._8_4_ * auVar31._8_4_;
            auVar61._12_4_ = -auVar28._12_4_ * auVar31._12_4_;
            auVar61._16_4_ = 0x80000000;
            auVar61._20_4_ = 0x80000000;
            auVar61._24_4_ = 0x80000000;
            auVar61._28_4_ = 0;
            auVar31 = vfmadd231ps_fma(auVar40,auVar41,*(undefined1 (*) [32])(uVar17 + 0x80));
            auVar59._0_4_ = -auVar29._0_4_ * auVar31._0_4_;
            auVar59._4_4_ = -auVar29._4_4_ * auVar31._4_4_;
            auVar59._8_4_ = -auVar29._8_4_ * auVar31._8_4_;
            auVar59._12_4_ = -auVar29._12_4_ * auVar31._12_4_;
            auVar59._16_4_ = 0x80000000;
            auVar59._20_4_ = 0x80000000;
            auVar59._24_4_ = 0x80000000;
            auVar59._28_4_ = 0;
            auVar41 = ZEXT1632(CONCAT412(auVar56._12_4_ + auVar65._12_4_,
                                         CONCAT48(auVar56._8_4_ + auVar65._8_4_,
                                                  CONCAT44(auVar56._4_4_ + auVar65._4_4_,
                                                           auVar56._0_4_ + auVar65._0_4_))));
            auVar42 = ZEXT1632(CONCAT412(auVar28._12_4_ + auVar61._12_4_,
                                         CONCAT48(auVar28._8_4_ + auVar61._8_4_,
                                                  CONCAT44(auVar28._4_4_ + auVar61._4_4_,
                                                           auVar28._0_4_ + auVar61._0_4_))));
            auVar46 = ZEXT1632(CONCAT412(auVar29._12_4_ + auVar59._12_4_,
                                         CONCAT48(auVar29._8_4_ + auVar59._8_4_,
                                                  CONCAT44(auVar29._4_4_ + auVar59._4_4_,
                                                           auVar29._0_4_ + auVar59._0_4_))));
            auVar43 = vpminsd_avx2(auVar65,auVar41);
            auVar39 = vpminsd_avx2(auVar61,auVar42);
            auVar40 = vpminsd_avx2(auVar59,auVar46);
            auVar39 = vmaxps_avx(auVar39,auVar40);
            auVar41 = vpmaxsd_avx2(auVar65,auVar41);
            auVar40 = vpmaxsd_avx2(auVar61,auVar42);
            auVar42 = vpmaxsd_avx2(auVar59,auVar46);
            auVar40 = vminps_avx(auVar40,auVar42);
            auVar42 = vmaxps_avx512vl(auVar35,auVar43);
            auVar39 = vmaxps_avx(auVar42,auVar39);
            auVar41 = vminps_avx(auVar50._0_32_,auVar41);
            auVar40 = vminps_avx(auVar41,auVar40);
            uVar27 = vcmpps_avx512vl(auVar39,auVar40,2);
          }
          auVar53 = ZEXT3264(auVar40);
          auVar52 = ZEXT3264(auVar39);
          bVar21 = (byte)uVar27;
          if (bVar21 == 0) break;
          auVar40 = *(undefined1 (*) [32])(uVar20 & 0xfffffffffffffff0);
          auVar53 = ZEXT3264(auVar40);
          auVar41 = ((undefined1 (*) [32])(uVar20 & 0xfffffffffffffff0))[1];
          auVar42 = vmovdqa64_avx512vl(auVar76._0_32_);
          auVar42 = vpternlogd_avx512vl(auVar42,auVar39,auVar77._0_32_,0xf8);
          auVar43 = vpcompressd_avx512vl(auVar42);
          auVar44._0_4_ =
               (uint)(bVar21 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar42._0_4_;
          bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar44._4_4_ = (uint)bVar25 * auVar43._4_4_ | (uint)!bVar25 * auVar42._4_4_;
          bVar25 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar44._8_4_ = (uint)bVar25 * auVar43._8_4_ | (uint)!bVar25 * auVar42._8_4_;
          bVar25 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar44._12_4_ = (uint)bVar25 * auVar43._12_4_ | (uint)!bVar25 * auVar42._12_4_;
          bVar25 = (bool)((byte)(uVar27 >> 4) & 1);
          auVar44._16_4_ = (uint)bVar25 * auVar43._16_4_ | (uint)!bVar25 * auVar42._16_4_;
          bVar25 = (bool)((byte)(uVar27 >> 5) & 1);
          auVar44._20_4_ = (uint)bVar25 * auVar43._20_4_ | (uint)!bVar25 * auVar42._20_4_;
          bVar25 = (bool)((byte)(uVar27 >> 6) & 1);
          auVar44._24_4_ = (uint)bVar25 * auVar43._24_4_ | (uint)!bVar25 * auVar42._24_4_;
          bVar25 = SUB81(uVar27 >> 7,0);
          auVar44._28_4_ = (uint)bVar25 * auVar43._28_4_ | (uint)!bVar25 * auVar42._28_4_;
          auVar42 = vpermt2q_avx512vl(auVar40,auVar44,auVar41);
          uVar20 = auVar42._0_8_;
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 != 0) {
            auVar42 = vpshufd_avx2(auVar44,0x55);
            vpermt2q_avx512vl(auVar40,auVar42,auVar41);
            auVar43 = vpminsd_avx2(auVar44,auVar42);
            auVar42 = vpmaxsd_avx2(auVar44,auVar42);
            bVar21 = bVar21 - 1 & bVar21;
            if (bVar21 == 0) {
              auVar43 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
              uVar20 = auVar43._0_8_;
              auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
              auVar53 = ZEXT3264(auVar40);
              (pSVar22->ptr).ptr = auVar40._0_8_;
              lVar18 = 8;
              lStack_2580 = 0x10;
            }
            else {
              auVar12 = vpshufd_avx2(auVar44,0xaa);
              vpermt2q_avx512vl(auVar40,auVar12,auVar41);
              auVar46 = vpminsd_avx2(auVar43,auVar12);
              auVar43 = vpmaxsd_avx2(auVar43,auVar12);
              auVar12 = vpminsd_avx2(auVar42,auVar43);
              auVar43 = vpmaxsd_avx2(auVar42,auVar43);
              bVar21 = bVar21 - 1 & bVar21;
              if (bVar21 == 0) {
                auVar42 = vpermi2q_avx512vl(auVar46,auVar40,auVar41);
                uVar20 = auVar42._0_8_;
                auVar42 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
                (pSVar22->ptr).ptr = auVar42._0_8_;
                auVar42 = vpermd_avx2(auVar43,auVar39);
                pSVar22->dist = auVar42._0_4_;
                auVar40 = vpermt2q_avx512vl(auVar40,auVar12,auVar41);
                auVar53 = ZEXT3264(auVar40);
                pSVar22[1].ptr.ptr = auVar40._0_8_;
                lStack_2580 = 0x18;
                lVar18 = lStack_2580;
                lStack_2580 = 0x20;
                auVar42 = auVar12;
              }
              else {
                auVar42 = vpshufd_avx2(auVar44,0xff);
                vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                auVar48 = vpminsd_avx2(auVar46,auVar42);
                auVar46 = vpmaxsd_avx2(auVar46,auVar42);
                auVar42 = vpminsd_avx2(auVar12,auVar46);
                auVar46 = vpmaxsd_avx2(auVar12,auVar46);
                auVar12 = vpminsd_avx2(auVar43,auVar46);
                auVar43 = vpmaxsd_avx2(auVar43,auVar46);
                bVar21 = bVar21 - 1 & bVar21;
                if (bVar21 != 0) {
                  auVar47 = valignd_avx512vl(auVar44,auVar44,3);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                  auVar48 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar46,auVar48);
                  auVar46 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar42 = vpermt2d_avx512vl(auVar48,auVar46,auVar42);
                  auVar46 = vpermt2d_avx512vl(auVar42,auVar46,auVar12);
                  auVar42 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar42 = vpermt2d_avx512vl(auVar46,auVar42,auVar43);
                  auVar63 = ZEXT3264(auVar42);
                  bVar19 = bVar21;
                  do {
                    auVar43 = auVar63._0_32_;
                    auVar62._8_4_ = 1;
                    auVar62._0_8_ = 0x100000001;
                    auVar62._12_4_ = 1;
                    auVar62._16_4_ = 1;
                    auVar62._20_4_ = 1;
                    auVar62._24_4_ = 1;
                    auVar62._28_4_ = 1;
                    auVar42 = vpermd_avx2(auVar62,auVar47);
                    auVar47 = valignd_avx512vl(auVar47,auVar47,1);
                    vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                    bVar19 = bVar19 - 1 & bVar19;
                    uVar13 = vpcmpd_avx512vl(auVar42,auVar43,5);
                    auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                    bVar14 = (byte)uVar13 << 1;
                    auVar43 = valignd_avx512vl(auVar43,auVar43,7);
                    bVar25 = (bool)((byte)uVar13 & 1);
                    bVar7 = (bool)(bVar14 >> 2 & 1);
                    bVar8 = (bool)(bVar14 >> 3 & 1);
                    bVar9 = (bool)(bVar14 >> 4 & 1);
                    bVar10 = (bool)(bVar14 >> 5 & 1);
                    bVar11 = (bool)(bVar14 >> 6 & 1);
                    auVar63 = ZEXT3264(CONCAT428((uint)(bVar14 >> 7) * auVar43._28_4_ |
                                                 (uint)!(bool)(bVar14 >> 7) * auVar42._28_4_,
                                                 CONCAT424((uint)bVar11 * auVar43._24_4_ |
                                                           (uint)!bVar11 * auVar42._24_4_,
                                                           CONCAT420((uint)bVar10 * auVar43._20_4_ |
                                                                     (uint)!bVar10 * auVar42._20_4_,
                                                                     CONCAT416((uint)bVar9 *
                                                                               auVar43._16_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar42._16_4_,
                                                                               CONCAT412((uint)bVar8
                                                                                         * auVar43.
                                                  _12_4_ | (uint)!bVar8 * auVar42._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar43._8_4_ |
                                                           (uint)!bVar7 * auVar42._8_4_,
                                                           CONCAT44((uint)bVar25 * auVar43._4_4_ |
                                                                    (uint)!bVar25 * auVar42._4_4_,
                                                                    auVar42._0_4_))))))));
                  } while (bVar19 != 0);
                  lVar18 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
                  while( true ) {
                    auVar43 = auVar63._0_32_;
                    auVar42 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
                    uVar20 = auVar42._0_8_;
                    bVar25 = lVar18 == 0;
                    lVar18 = lVar18 + -1;
                    if (bVar25) break;
                    (pSVar22->ptr).ptr = uVar20;
                    auVar42 = vpermd_avx2(auVar43,auVar39);
                    pSVar22->dist = auVar42._0_4_;
                    auVar42 = valignd_avx512vl(auVar43,auVar43,1);
                    auVar63 = ZEXT3264(auVar42);
                    pSVar22 = pSVar22 + 1;
                  }
                  goto LAB_01c52513;
                }
                auVar46 = vpermi2q_avx512vl(auVar48,auVar40,auVar41);
                uVar20 = auVar46._0_8_;
                auVar46 = vpermt2q_avx512vl(auVar40,auVar43,auVar41);
                (pSVar22->ptr).ptr = auVar46._0_8_;
                auVar43 = vpermd_avx2(auVar43,auVar39);
                pSVar22->dist = auVar43._0_4_;
                auVar43 = vpermt2q_avx512vl(auVar40,auVar12,auVar41);
                pSVar22[1].ptr.ptr = auVar43._0_8_;
                auVar43 = vpermd_avx2(auVar12,auVar39);
                pSVar22[1].dist = auVar43._0_4_;
                auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                auVar53 = ZEXT3264(auVar40);
                pSVar22[2].ptr.ptr = auVar40._0_8_;
                lVar18 = 0x28;
                lStack_2580 = 0x30;
              }
            }
            auVar39 = vpermd_avx2(auVar42,auVar39);
            auVar52 = ZEXT3264(auVar39);
            *(int *)((long)&(pSVar22->ptr).ptr + lVar18) = auVar39._0_4_;
            pSVar22 = (StackItemT<embree::NodeRefPtr<8>_> *)
                      ((long)&(pSVar22->ptr).ptr + lStack_2580);
          }
        } while( true );
      }
      goto LAB_01c524f7;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }